

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall
UI::renderMessages(UI *this,
                  vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *messages,
                  int width,bool isThread)

{
  ImVec4 *col;
  ImVec4 *col_00;
  int *piVar1;
  pointer pUVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  size_type sVar5;
  __type _Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  ImU32 col_01;
  int iVar10;
  ImDrawList *this_00;
  ImGuiIO *pIVar11;
  pointer pMVar12;
  char *pcVar13;
  pointer pMVar14;
  ulong uVar15;
  int i;
  int n;
  ulong uVar16;
  pointer pMVar17;
  UI *pUVar18;
  int32_t iVar19;
  long lVar20;
  float fVar21;
  ImVec2 local_f8;
  ImVec2 p0;
  ImVec2 p1;
  string curDate;
  float local_a8;
  ImVec2 local_90;
  int local_88;
  float local_84;
  ImVec4 *local_80;
  ImVec4 *local_78;
  long local_70;
  ImVec4 *local_68;
  vector<MessageWithReplies,_std::allocator<MessageWithReplies>_> *local_60;
  long local_58;
  string lastDate;
  
  local_60 = messages;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lastDate,"",(allocator<char> *)&curDate);
  ImGui::PushTextWrapPos((float)(width + -4));
  local_88 = width / 2;
  if (isThread) {
    fVar21 = 7.0;
  }
  else {
    fVar21 = 12.0;
  }
  col = &(this->colors).messageUser;
  local_80 = &(this->colors).messageTime;
  col_00 = &(this->colors).messageReact;
  local_84 = (float)width;
  local_78 = &(this->colors).messageReplies;
  local_68 = &(this->colors).messageHovered;
  iVar19 = -1;
  lVar20 = 0;
  do {
    pMVar17 = (local_60->super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(local_60->
                     super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar17) / 0x48) <= lVar20) {
      ImGui::PopTextWrapPos();
      std::__cxx11::string::~string((string *)&lastDate);
      return true;
    }
    iVar10 = pMVar17[lVar20].msg.uid;
    pUVar2 = (this->users).super__Vector_base<User,_std::allocator<User>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_70 = lVar20;
    ImGui::PushID((int)lVar20);
    pMVar17 = pMVar17 + lVar20;
    local_58 = lVar20 * 0x48;
    tToDate_abi_cxx11_(&curDate,(pMVar17->msg).t_s);
    _Var6 = std::operator==(&curDate,&lastDate);
    sVar5 = curDate._M_string_length;
    if (!_Var6) {
      pUVar18 = (UI *)0x16552f;
      ImGui::Text("%s","");
      n = ~(uint)(sVar5 + 6 >> 1) + local_88;
      renderSeparator(pUVar18,"","-","",n,true);
      ImGui::SameLine(0.0,-1.0);
      pUVar18 = (UI *)0x16552f;
      ImGui::Text("%s",curDate._M_dataplus._M_p);
      ImGui::SameLine(0.0,-1.0);
      renderSeparator(pUVar18,"","-","",n,true);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&lastDate,&curDate);
    }
    std::__cxx11::string::~string((string *)&curDate);
    IVar3 = ImGui::GetCursorScreenPos();
    IVar4 = ImGui::GetCursorScreenPos();
    p0.y = IVar4.y;
    local_a8 = IVar3.x;
    p0.x = local_a8;
    if (iVar19 != (pMVar17->msg).uid) {
      ImGui::Text("%s","");
      ImGui::TextColored(col,"%s",pUVar2[iVar10].username._M_dataplus._M_p);
      ImGui::SameLine(0.0,-1.0);
      tToTime_abi_cxx11_(&curDate,(pMVar17->msg).t_s);
      ImGui::TextColored(local_80,"%s",curDate._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&curDate);
    }
    ImGui::Text("%s",(pMVar17->msg).text._M_dataplus._M_p);
    if (0 < (pMVar17->msg).reactUp) {
      ImGui::TextColored(col_00,"%s","[+]");
      ImGui::SameLine(0.0,-1.0);
      ImGui::Text("%d",(ulong)(uint)(pMVar17->msg).reactUp);
    }
    if (0 < (pMVar17->msg).reactDown) {
      if (0 < (pMVar17->msg).reactUp) {
        ImGui::SameLine(0.0,-1.0);
      }
      ImGui::TextColored(col_00,"%s","[-]");
      ImGui::SameLine(0.0,-1.0);
      ImGui::Text("%d",(ulong)(uint)(pMVar17->msg).reactDown);
    }
    pMVar14 = (pMVar17->replies).
              super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>._M_impl.
              super__Vector_impl_data._M_start;
    pMVar12 = *(pointer *)
               ((long)&(pMVar17->replies).
                       super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                       _M_impl + 8);
    if (pMVar12 != pMVar14) {
      if ((0 < (pMVar17->msg).reactUp) || (0 < (pMVar17->msg).reactDown)) {
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("|");
        ImGui::SameLine(0.0,-1.0);
        pMVar14 = (pMVar17->replies).
                  super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pMVar12 = *(pointer *)
                   ((long)&(pMVar17->replies).
                           super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                           ._M_impl + 8);
      }
      ImGui::TextColored(local_78,"%d replies",((long)pMVar12 - (long)pMVar14) / 0x48 & 0xffffffff);
    }
    IVar3 = ImGui::GetCursorScreenPos();
    IVar4 = ImGui::GetCursorScreenPos();
    p1.y = IVar4.y;
    local_a8 = IVar3.x;
    p1.x = local_a8 + local_84;
    bVar7 = ImGui::IsWindowHovered(0);
    if (bVar7) {
      bVar7 = ImGui::IsMouseHoveringRect(&p0,&p1,true);
      if (bVar7) {
        this_00 = ImGui::GetWindowDrawList();
        curDate._M_dataplus._M_p._4_4_ = p0.y + 1.0;
        curDate._M_dataplus._M_p._0_4_ = p0.x;
        local_f8.y = p1.y + -1.0;
        local_f8.x = p1.x;
        col_01 = ImGui::ColorConvertFloat4ToU32(local_68);
        ImDrawList::AddRectFilled(this_00,(ImVec2 *)&curDate,&local_f8,col_01,0.0,0xf);
        ImGui::SetCursorScreenPos(&p0);
        if (iVar19 != (pMVar17->msg).uid) {
          ImGui::Text("%s","");
          ImGui::TextColored(col,"%s",pUVar2[iVar10].username._M_dataplus._M_p);
          ImGui::SameLine(0.0,-1.0);
          tToTime_abi_cxx11_(&curDate,(pMVar17->msg).t_s);
          ImGui::TextColored(local_80,"%s",curDate._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&curDate);
        }
        ImGui::Text("%s");
        if (0 < (pMVar17->msg).reactUp) {
          ImGui::TextColored(col_00,"%s","[+]");
          bVar7 = ImGui::IsItemHovered(0);
          if (bVar7) {
            pIVar11 = ImGui::GetIO();
            curDate._M_dataplus._M_p = (pointer)CONCAT44(p0.y + -4.0,(pIVar11->MousePos).x + -10.0);
            local_f8.x = 0.0;
            local_f8.y = 0.0;
            ImGui::SetNextWindowPos((ImVec2 *)&curDate,0,&local_f8);
            curDate._M_dataplus._M_p = (pointer)0x42200000;
            ImGui::SetNextWindowSize((ImVec2 *)&curDate,0);
            ImGui::BeginTooltip();
            ImGui::Text("%s","");
            ImGui::TextColored(col_00,"%s","[+]");
            ImGui::Text("%s","");
            uVar16 = 0;
            lVar20 = 0;
            while( true ) {
              iVar10 = (pMVar17->msg).reactUp;
              if ((long)iVar10 <= (long)uVar16) break;
              pUVar2 = (this->users).super__Vector_base<User,_std::allocator<User>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar15 = uVar16 % (ulong)(((long)(this->users).
                                               super__Vector_base<User,_std::allocator<User>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)pUVar2) / 0x60);
              pcVar13 = ",";
              if (uVar16 == iVar10 - 2) {
                pcVar13 = " and";
              }
              if (uVar16 == iVar10 - 1) {
                pcVar13 = "";
              }
              ImGui::TextColored(col,"%s%s",pUVar2[uVar15].username._M_dataplus._M_p,pcVar13);
              lVar20 = (long)(int)lVar20 + pUVar2[uVar15].username._M_string_length;
              if ((int)lVar20 < 0x14) {
                ImGui::SameLine(0.0,-1.0);
              }
              else {
                lVar20 = 0;
              }
              uVar16 = uVar16 + 1;
            }
            ImGui::Text("reacted with :+1:");
            ImGui::Text("%s","");
            ImGui::EndTooltip();
          }
          ImGui::SameLine(0.0,-1.0);
          ImGui::Text("%d");
        }
        if (0 < (pMVar17->msg).reactDown) {
          if (0 < (pMVar17->msg).reactUp) {
            ImGui::SameLine(0.0,-1.0);
          }
          ImGui::TextColored(col_00,"%s","[-]");
          bVar7 = ImGui::IsItemHovered(0);
          if (bVar7) {
            pIVar11 = ImGui::GetIO();
            curDate._M_dataplus._M_p = (pointer)CONCAT44(p0.y + -4.0,(pIVar11->MousePos).x + -10.0);
            local_f8.x = 0.0;
            local_f8.y = 0.0;
            ImGui::SetNextWindowPos((ImVec2 *)&curDate,0,&local_f8);
            curDate._M_dataplus._M_p = (pointer)0x42200000;
            ImGui::SetNextWindowSize((ImVec2 *)&curDate,0);
            ImGui::BeginTooltip();
            ImGui::Text("%s","");
            ImGui::TextColored(col_00,"%s","[-]");
            ImGui::Text("%s","");
            uVar16 = 0;
            lVar20 = 0;
            while( true ) {
              iVar10 = (pMVar17->msg).reactDown;
              if ((long)iVar10 <= (long)uVar16) break;
              pUVar2 = (this->users).super__Vector_base<User,_std::allocator<User>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar15 = uVar16 % (ulong)(((long)(this->users).
                                               super__Vector_base<User,_std::allocator<User>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)pUVar2) / 0x60);
              pcVar13 = ",";
              if (uVar16 == iVar10 - 2) {
                pcVar13 = " and";
              }
              if (uVar16 == iVar10 - 1) {
                pcVar13 = "";
              }
              ImGui::TextColored(col,"%s%s",pUVar2[uVar15].username._M_dataplus._M_p,pcVar13);
              lVar20 = (long)(int)lVar20 + pUVar2[uVar15].username._M_string_length;
              if ((int)lVar20 < 0x14) {
                ImGui::SameLine(0.0,-1.0);
              }
              else {
                lVar20 = 0;
              }
              uVar16 = uVar16 + 1;
            }
            ImGui::Text("reacted with :-1:");
            ImGui::Text("%s","");
            ImGui::EndTooltip();
          }
          ImGui::SameLine(0.0,-1.0);
          ImGui::Text("%d");
        }
        pMVar14 = (pMVar17->replies).
                  super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pMVar12 = *(pointer *)
                   ((long)&(pMVar17->replies).
                           super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                           ._M_impl + 8);
        if (pMVar12 == pMVar14) {
LAB_0010dde7:
          bVar7 = false;
        }
        else {
          if ((0 < (pMVar17->msg).reactUp) || (0 < (pMVar17->msg).reactDown)) {
            ImGui::SameLine(0.0,-1.0);
            ImGui::Text("|");
            ImGui::SameLine(0.0,-1.0);
            pMVar14 = (pMVar17->replies).
                      super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pMVar12 = *(pointer *)
                       ((long)&(pMVar17->replies).
                               super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                               ._M_impl + 8);
          }
          ImGui::TextColored(local_78,"%d replies",
                             ((long)pMVar12 - (long)pMVar14) / 0x48 & 0xffffffff);
          bVar7 = ImGui::IsItemHovered(0);
          if (!bVar7) goto LAB_0010dde7;
          ImGui::SameLine(0.0,-1.0);
          ImGui::SmallButton("View thread");
          bVar7 = ImGui::IsMouseDown(0);
        }
        curDate._M_dataplus._M_p = (pointer)ImGui::GetCursorScreenPos();
        local_f8.y = p0.y;
        local_f8.x = p1.x - fVar21;
        ImGui::SetCursorScreenPos(&local_f8);
        ImGui::SmallButton("[+]");
        bVar8 = ImGui::IsItemHovered(0);
        if (bVar8) {
          bVar8 = ImGui::IsMouseReleased(0);
          pIVar11 = ImGui::GetIO();
          IVar3 = pIVar11->MousePos;
          pIVar11 = ImGui::GetIO();
          local_a8 = IVar3.x;
          local_f8.y = (pIVar11->MousePos).y + -2.0;
          local_f8.x = local_a8 + -10.0;
          local_90.x = 0.0;
          local_90.y = 0.0;
          ImGui::SetNextWindowPos(&local_f8,0,&local_90);
          ImGui::SetTooltip("React with +1");
        }
        else {
          bVar8 = false;
        }
        if (!isThread) {
          ImGui::SameLine(0.0,-1.0);
          ImGui::SmallButton("[>]");
          bVar9 = ImGui::IsItemHovered(0);
          if (bVar9) {
            bVar9 = ImGui::IsMouseDown(0);
            pIVar11 = ImGui::GetIO();
            IVar3 = pIVar11->MousePos;
            pIVar11 = ImGui::GetIO();
            local_a8 = IVar3.x;
            local_f8.y = (pIVar11->MousePos).y + -2.0;
            local_f8.x = local_a8 + -16.0;
            local_90.x = 0.0;
            local_90.y = 0.0;
            ImGui::SetNextWindowPos(&local_f8,0,&local_90);
            ImGui::SetTooltip("Reply in thread");
            bVar7 = (bool)(bVar9 | bVar7);
          }
        }
        ImGui::SetCursorScreenPos((ImVec2 *)&curDate);
        if (bVar8 == true && !isThread) {
          iVar10 = this->selectedChannel;
          piVar1 = (int *)(*(long *)&(this->channels).
                                     super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl.
                                     super__Vector_impl_data._M_start[iVar10].messages.
                                     super__Vector_base<MessageWithReplies,_std::allocator<MessageWithReplies>_>
                                     ._M_impl.super__Vector_impl_data + 0x28 + local_58);
          *piVar1 = *piVar1 + 1;
          if (bVar7 != false) goto LAB_0010df65;
        }
        else if (bVar7 != false) {
          iVar10 = this->selectedChannel;
LAB_0010df65:
          this->showThreadPanel = true;
          this->threadChannel = iVar10;
          this->threadMessage = (int)local_70;
        }
      }
    }
    ImGui::PopID();
    iVar19 = (pMVar17->msg).uid;
    lVar20 = local_70 + 1;
  } while( true );
}

Assistant:

bool UI::renderMessages(const std::vector<MessageWithReplies> & messages, int width, bool isThread) {
    int32_t lastUid = -1;
    std::string lastDate = "";

    ImGui::PushTextWrapPos(width - 4);

    for (int i = 0; i < (int) messages.size(); i++) {
        const auto & message = messages[i];
        const auto & uid = message.msg.uid;
        const auto & user = users[uid];

        ImGui::PushID(i);

        // render new date separator
        {
            const auto curDate = tToDate(message.msg.t_s);
            if (curDate != lastDate) {
                const auto l = curDate.size() + 6;

                ImGui::Text("%s", "");
                renderSeparator("", "-", "", width/2 - l/2 - 1, true);
                ImGui::SameLine();
                ImGui::Text("%s", curDate.c_str());
                ImGui::SameLine();
                renderSeparator("", "-", "", width/2 - l/2 - 1, true);
                lastDate = curDate;
            }
        }

        const auto p0 = ImVec2 { ImGui::GetCursorScreenPos().x, ImGui::GetCursorScreenPos().y };

        if (lastUid != uid) {
            ImGui::Text("%s", "");
            ImGui::TextColored(colors.messageUser, "%s", user.username.c_str());
            ImGui::SameLine();
            ImGui::TextColored(colors.messageTime, "%s", tToTime(message.msg.t_s).c_str());
        }
        ImGui::Text("%s", message.msg.text.c_str());
        if (message.msg.reactUp > 0) {
            ImGui::TextColored(colors.messageReact, "%s", "[+]");
            ImGui::SameLine();
            ImGui::Text("%d", message.msg.reactUp);
        }

        if (message.msg.reactDown > 0) {
            if (message.msg.reactUp > 0) {
                ImGui::SameLine();
            }
            ImGui::TextColored(colors.messageReact, "%s", "[-]");
            ImGui::SameLine();
            ImGui::Text("%d", message.msg.reactDown);
        }

        if (message.replies.size() > 0) {
            if (message.msg.reactUp > 0 || message.msg.reactDown > 0) {
                ImGui::SameLine();
                ImGui::Text("|");
                ImGui::SameLine();
            }
            ImGui::TextColored(colors.messageReplies, "%d replies", (int) message.replies.size());
        }

        const auto p1 = ImVec2 { ImGui::GetCursorScreenPos().x + width, ImGui::GetCursorScreenPos().y };

        bool doUpvote = false;
        bool doReplyInThead = false;

        if (ImGui::IsWindowHovered() && ImGui::IsMouseHoveringRect(p0, p1)) {
            auto drawList = ImGui::GetWindowDrawList();

            drawList->AddRectFilled({ p0.x, p0.y + 1 }, { p1.x, p1.y - 1 }, ImGui::ColorConvertFloat4ToU32(colors.messageHovered));

            ImGui::SetCursorScreenPos(p0);

            if (lastUid != uid) {
                ImGui::Text("%s", "");
                ImGui::TextColored(colors.messageUser, "%s", user.username.c_str());
                ImGui::SameLine();
                ImGui::TextColored(colors.messageTime, "%s", tToTime(message.msg.t_s).c_str());
            }
            ImGui::Text("%s", message.msg.text.c_str());
            if (message.msg.reactUp > 0) {
                ImGui::TextColored(colors.messageReact, "%s", "[+]");
                if (ImGui::IsItemHovered()) {
                    ImGui::SetNextWindowPos({ ImGui::GetIO().MousePos.x - 10, p0.y - 4 });
                    ImGui::SetNextWindowSize({ 40, 0 });
                    ImGui::BeginTooltip();
                    ImGui::Text("%s", "");
                    ImGui::TextColored(colors.messageReact, "%s", "[+]");
                    ImGui::Text("%s", "");
                    int w = 0;
                    for (int i = 0; i < message.msg.reactUp; i++) {
                        const auto & username = users[i%users.size()].username;
                        ImGui::TextColored(colors.messageUser, "%s%s", username.c_str(),
                                           i == message.msg.reactUp - 1 ? "" : i == message.msg.reactUp - 2 ? " and" : ",");
                        if (w += username.size(); w < 20) {
                            ImGui::SameLine();
                        } else {
                            w = 0;
                        }
                    }
                    ImGui::Text("reacted with :+1:");
                    ImGui::Text("%s", "");
                    ImGui::EndTooltip();
                }
                ImGui::SameLine();
                ImGui::Text("%d", message.msg.reactUp);
            }

            if (message.msg.reactDown > 0) {
                if (message.msg.reactUp > 0) {
                    ImGui::SameLine();
                }
                ImGui::TextColored(colors.messageReact, "%s", "[-]");
                if (ImGui::IsItemHovered()) {
                    ImGui::SetNextWindowPos({ ImGui::GetIO().MousePos.x - 10, p0.y - 4 });
                    ImGui::SetNextWindowSize({ 40, 0 });
                    ImGui::BeginTooltip();
                    ImGui::Text("%s", "");
                    ImGui::TextColored(colors.messageReact, "%s", "[-]");
                    ImGui::Text("%s", "");
                    int w = 0;
                    for (int i = 0; i < message.msg.reactDown; i++) {
                        const auto & username = users[i%users.size()].username;
                        ImGui::TextColored(colors.messageUser, "%s%s", username.c_str(),
                                             i == message.msg.reactDown - 1 ? "" : i == message.msg.reactDown - 2 ? " and" : ",");
                        if (w += username.size(); w < 20) {
                            ImGui::SameLine();
                        } else {
                            w = 0;
                        }
                    }
                    ImGui::Text("reacted with :-1:");
                    ImGui::Text("%s", "");
                    ImGui::EndTooltip();
                }
                ImGui::SameLine();
                ImGui::Text("%d", message.msg.reactDown);
            }

            if (message.replies.size() > 0) {
                if (message.msg.reactUp > 0 || message.msg.reactDown > 0) {
                    ImGui::SameLine();
                    ImGui::Text("|");
                    ImGui::SameLine();
                }
                ImGui::TextColored(colors.messageReplies, "%d replies", (int) message.replies.size());
                if (ImGui::IsItemHovered()) {
                    ImGui::SameLine();
                    ImGui::SmallButton("View thread");
                    if (ImGui::IsMouseDown(0)) {
                        doReplyInThead = true;
                    }
                }
            }

            auto savePos = ImGui::GetCursorScreenPos();

            const int offsetX = isThread ? 7 : 12;

            ImGui::SetCursorScreenPos({ p1.x - offsetX, p0.y });
            ImGui::SmallButton("[+]");
            if (ImGui::IsItemHovered()) {
                if (ImGui::IsMouseReleased(0)) {
                    doUpvote = true;
                }
                ImGui::SetNextWindowPos({ ImGui::GetIO().MousePos.x - 10, ImGui::GetIO().MousePos.y - 2 });
                ImGui::SetTooltip("React with +1");
            }

            if (!isThread) {
                ImGui::SameLine();
                ImGui::SmallButton("[>]");
                if (ImGui::IsItemHovered()) {
                    if (ImGui::IsMouseDown(0)) {
                        doReplyInThead = true;
                    }
                    ImGui::SetNextWindowPos({ ImGui::GetIO().MousePos.x - 16, ImGui::GetIO().MousePos.y - 2 });
                    ImGui::SetTooltip("Reply in thread");
                }
            }

            ImGui::SetCursorScreenPos(savePos);
        }

        if (doUpvote) {
            if (!isThread) {
                channels[selectedChannel].messages[i].msg.reactUp++;
            }
        }

        if (doReplyInThead) {
            showThreadPanel = true;
            threadChannel = selectedChannel;
            threadMessage = i;
        }

        ImGui::PopID();

        lastUid = uid;
    }

    ImGui::PopTextWrapPos();

    return true;
}